

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QCache<QString,_QRegularExpression>::Node>::erase
          (Data<QCache<QString,_QRegularExpression>::Node> *this,Bucket bucket)

{
  Bucket rhs;
  Bucket lhs;
  Bucket rhs_00;
  Bucket lhs_00;
  bool bVar1;
  size_t sVar2;
  Span<QCache<QString,_QRegularExpression>::Node> *in_RDX;
  Span *in_RSI;
  Span<QCache<QString,_QRegularExpression>::Node> *in_RDI;
  long in_FS_OFFSET;
  size_t hash;
  size_t offset;
  Bucket newBucket;
  Bucket next;
  Bucket *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  Span *to;
  undefined1 *fromIndex;
  Span *fromSpan;
  Span<QCache<QString,_QRegularExpression>::Node> *this_00;
  Bucket local_38;
  Span *local_28;
  Span<QCache<QString,_QRegularExpression>::Node> *local_20;
  Span *local_18;
  Span<QCache<QString,_QRegularExpression>::Node> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  local_10 = in_RDX;
  Span<QCache<QString,_QRegularExpression>::Node>::erase(in_RDI,in_stack_ffffffffffffff78);
  *(long *)(in_RDI->offsets + 8) = *(long *)(in_RDI->offsets + 8) + -1;
  local_28 = local_18;
  local_20 = local_10;
  do {
    Bucket::advanceWrapped
              (in_stack_ffffffffffffff70,(Data<QCache<QString,_QRegularExpression>::Node> *)in_RDI);
    sVar2 = Bucket::offset((Bucket *)0x1216a9);
    if (sVar2 == 0xff) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    Bucket::nodeAtOffset(in_stack_ffffffffffffff70,(size_t)in_RDI);
    in_stack_ffffffffffffff70 =
         (Bucket *)calculateHash<QString>((QString *)in_stack_ffffffffffffff70,(size_t)in_RDI);
    local_38.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    sVar2 = GrowthPolicy::bucketForHash
                      (*(size_t *)(in_RDI->offsets + 0x10),(size_t)in_stack_ffffffffffffff70);
    Bucket::Bucket(&local_38,(Data<QCache<QString,_QRegularExpression>::Node> *)in_RDI,sVar2);
    while (lhs_00.index = local_38.index, lhs_00.span = local_38.span,
          rhs_00.index = (size_t)local_20, rhs_00.span = local_28, fromSpan = local_28,
          this_00 = local_20, bVar1 = operator==(lhs_00,rhs_00), !bVar1) {
      lhs.index = local_38.index;
      lhs.span = local_38.span;
      rhs.index = (size_t)local_10;
      rhs.span = local_18;
      to = local_38.span;
      fromIndex = (undefined1 *)local_38.index;
      bVar1 = operator==(lhs,rhs);
      if (bVar1) {
        if (local_28 == local_18) {
          Span<QCache<QString,_QRegularExpression>::Node>::moveLocal
                    (local_18,(size_t)local_20,(size_t)local_10);
        }
        else {
          Span<QCache<QString,_QRegularExpression>::Node>::moveFromSpan
                    (this_00,fromSpan,(size_t)fromIndex,(size_t)to);
        }
        local_18 = local_28;
        local_10 = local_20;
        break;
      }
      Bucket::advanceWrapped
                (in_stack_ffffffffffffff70,(Data<QCache<QString,_QRegularExpression>::Node> *)in_RDI
                );
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }